

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

int __thiscall Darts::Details::DawgBuilder::init(DawgBuilder *this,EVP_PKEY_CTX *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  int extraout_EAX;
  ulong uVar4;
  size_t sVar5;
  uint local_10 [2];
  
  local_10[1] = 0;
  AutoPool<unsigned_int>::resize(&this->table_,0x400,local_10 + 1);
  sVar5 = (this->recycle_bin_).pool_.size_;
  if (sVar5 == 0) {
    AutoPool<Darts::Details::DawgNode>::append(&this->nodes_);
  }
  else {
    pcVar3 = (this->nodes_).buf_.array_;
    uVar4 = (ulong)*(uint *)((this->recycle_bin_).pool_.buf_.array_ + sVar5 * 4 + -4);
    pcVar2 = pcVar3 + uVar4 * 0xc + 7;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar3 = pcVar3 + uVar4 * 0xc;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    psVar1 = &(this->recycle_bin_).pool_.size_;
    *psVar1 = *psVar1 - 1;
  }
  BitVector::append(&this->is_intersections_);
  AutoPool<Darts::Details::DawgUnit>::append(&this->units_);
  sVar5 = (this->labels_).size_;
  if (sVar5 == (this->labels_).capacity_) {
    AutoPool<unsigned_char>::resize_buf(&this->labels_,sVar5 + 1);
    sVar5 = (this->labels_).size_;
  }
  (this->labels_).size_ = sVar5 + 1;
  this->num_states_ = 1;
  (this->nodes_).buf_.array_[8] = -1;
  local_10[0] = 0;
  AutoPool<unsigned_int>::append(&(this->node_stack_).pool_,local_10);
  return extraout_EAX;
}

Assistant:

inline void DawgBuilder::init() {
  table_.resize(INITIAL_TABLE_SIZE, 0);

  append_node();
  append_unit();

  num_states_ = 1;

  nodes_[0].set_label(0xFF);
  node_stack_.push(0);
}